

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulation.cpp
# Opt level: O1

bool __thiscall
TRM::Triangulation::check_intersection
          (Triangulation *this,Edge *left,Edge *right,ActiveEdgeList *ael,Vertex **current)

{
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *paVar1;
  float fVar2;
  vec2 vVar3;
  ActiveEdgeList *pAVar4;
  bool bVar5;
  bool bVar6;
  VertexList *pVVar7;
  Vertex *v;
  Vertex *ael_00;
  Vertex *pVVar8;
  Vertex **current_00;
  vec2 p;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_58;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_54;
  Vertex *local_50;
  Vertex *local_48;
  Vertex *local_40;
  ActiveEdgeList *local_38;
  
  if (right == (Edge *)0x0 || left == (Edge *)0x0) {
    return false;
  }
  current_00 = current;
  bVar5 = Edge::intersect(left,right,(vec2 *)&local_58);
  if (((!bVar5) ||
      (ael_00 = (Vertex *)(ulong)((uint)local_58 & 0x7fffffff),
      ((uint)local_58 & 0x7fffffff) == 0x7f800000)) ||
     (((uint)aStack_54 & 0x7fffffff) == 0x7f800000)) {
    bVar5 = intersect_pair_edge(this,left,right,ael,current);
    return bVar5;
  }
  pVVar8 = *current;
  while ((pVVar8 != (Vertex *)0x0 &&
         (bVar5 = VertexCompare::Compare((vec2 *)&local_58,&pVVar8->point), bVar5))) {
    pVVar8 = pVVar8->prev;
  }
  v = left->top;
  if ((local_58.x == (v->point).field_0.x) && (!NAN(local_58.x) && !NAN((v->point).field_0.x))) {
    paVar1 = &(v->point).field_1;
    if ((aStack_54.y == paVar1->y) && (!NAN(aStack_54.y) && !NAN(paVar1->y))) goto LAB_0011a05f;
  }
  v = left->bottom;
  if ((local_58.x == (v->point).field_0.x) && (!NAN(local_58.x) && !NAN((v->point).field_0.x))) {
    paVar1 = &(v->point).field_1;
    if ((aStack_54.y == paVar1->y) && (!NAN(aStack_54.y) && !NAN(paVar1->y))) goto LAB_0011a05f;
  }
  v = right->top;
  if ((local_58.x == (v->point).field_0.x) && (!NAN(local_58.x) && !NAN((v->point).field_0.x))) {
    paVar1 = &(v->point).field_1;
    if ((aStack_54.y == paVar1->y) && (!NAN(aStack_54.y) && !NAN(paVar1->y))) goto LAB_0011a05f;
  }
  v = right->bottom;
  pAVar4 = ael;
  if ((local_58.x == (v->point).field_0.x) &&
     (pAVar4 = ael, !NAN(local_58.x) && !NAN((v->point).field_0.x))) {
    paVar1 = &(v->point).field_1;
    pAVar4 = ael;
    if ((aStack_54.y == paVar1->y) && (pAVar4 = ael, !NAN(aStack_54.y) && !NAN(paVar1->y)))
    goto LAB_0011a05f;
  }
  for (; local_38 = pAVar4, pVVar8 != (Vertex *)0x0; pVVar8 = pVVar8->prev) {
    bVar5 = VertexCompare::Compare((vec2 *)&local_58,&pVVar8->point);
    if (!bVar5) {
      pVVar7 = (VertexList *)&pVVar8->next;
      goto LAB_00119f55;
    }
    pAVar4 = local_38;
  }
  pVVar7 = &this->mesh_;
LAB_00119f55:
  ael_00 = (pVVar7->super_LinkedList<TRM::Vertex>).head;
  bVar5 = ael_00 == (Vertex *)0x0;
  local_40 = pVVar8;
  if (bVar5) {
    local_48 = (Vertex *)CONCAT71(local_48._1_7_,bVar5);
    ael = local_38;
  }
  else {
    local_50 = ael_00;
    bVar6 = VertexCompare::Compare(&ael_00->point,(vec2 *)&local_58);
    ael = local_38;
    if (bVar6) {
      do {
        local_40 = local_50;
        ael_00 = local_50->next;
        local_48 = (Vertex *)CONCAT71(local_48._1_7_,ael_00 == (Vertex *)0x0);
        if (ael_00 == (Vertex *)0x0) break;
        local_50 = ael_00;
        bVar5 = VertexCompare::Compare(&ael_00->point,(vec2 *)&local_58);
        ael_00 = local_50;
      } while (bVar5);
    }
    else {
      local_48 = (Vertex *)CONCAT71(local_48._1_7_,bVar5);
      ael_00 = local_50;
    }
  }
  if (local_40 != (Vertex *)0x0) {
    fVar2 = (local_40->point).field_0.x;
    if ((fVar2 == local_58.x) && (!NAN(fVar2) && !NAN(local_58.x))) {
      fVar2 = (local_40->point).field_1.y;
      if ((fVar2 == aStack_54.y) && (v = local_40, !NAN(fVar2) && !NAN(aStack_54.y)))
      goto LAB_0011a05f;
    }
  }
  if (((((char)local_48 != '\0') || (fVar2 = (ael_00->point).field_0.x, fVar2 != local_58.x)) ||
      (NAN(fVar2) || NAN(local_58.x))) ||
     ((fVar2 = (ael_00->point).field_1.y, fVar2 != aStack_54.y ||
      (v = ael_00, NAN(fVar2) || NAN(aStack_54.y))))) {
    local_50 = ael_00;
    local_48 = ObjectHeap::Allocate<TRM::Vertex,glm::vec<2,float,(glm::qualifier)0>&>
                         (&this->heap_,(vec<2,_float,_(glm::qualifier)0> *)&local_58);
    vVar3.field_1.y = aStack_54.y;
    vVar3.field_0.x = local_58.x;
    local_48->point = vVar3;
    ael_00 = local_50;
    VertexList::insert(&this->mesh_,local_48,local_40,local_50);
    v = local_48;
  }
LAB_0011a05f:
  ActiveEdgeList::rewind(ael,(FILE *)current);
  split_edge(this,left,v,(ActiveEdgeList *)ael_00,current_00);
  split_edge(this,right,v,(ActiveEdgeList *)ael_00,current_00);
  return true;
}

Assistant:

bool Triangulation::check_intersection(Edge* left, Edge* right,
                                       ActiveEdgeList* ael, Vertex** current) {
  if (!left || !right) {
    return false;
  }

  glm::vec2 p;

  if (left->intersect(right, &p) && !glm::isinf(p.x) && !glm::isinf(p.y)) {
    Vertex* v;
    Vertex* top = *current;

    // the vertex in mesh is sorted, so walk to prev can find latest top point
    while (top && VertexCompare::Compare(p, top->point)) {
      top = top->prev;
    }

    if (p == left->top->point) {
      v = left->top;
    } else if (p == left->bottom->point) {
      v = left->bottom;
    } else if (p == right->top->point) {
      v = right->top;
    } else if (p == right->bottom->point) {
      v = right->bottom;
    } else {
      // intersect point is between start and end point
      // need to insert new vertex
      auto prev = top;
      while (prev && VertexCompare::Compare(p, prev->point)) {
        prev = prev->prev;
      }

      auto next = prev ? prev->next : mesh_.head;
      while (next && VertexCompare::Compare(next->point, p)) {
        prev = next;
        next = next->next;
      }

      // check if point is already in mesh
      if (prev && prev->point == p) {
        v = prev;
      } else if (next && next->point == p) {
        v = next;
      } else {
        v = heap_.Allocate<Vertex>(p);
        v->point = p;

        mesh_.insert(v, prev, next);
      }
    }
    ael->rewind(current, top ? top : v);

    split_edge(left, v, ael, current);
    split_edge(right, v, ael, current);
    return true;
  }

  return intersect_pair_edge(left, right, ael, current);
}